

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpgd.cpp
# Opt level: O2

void jpgd::DCT_Upsample::R_S<7,_8>::calc(Matrix44 *R,Matrix44 *S,jpgd_block_t *pSrc)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  short sVar28;
  short sVar29;
  short sVar30;
  short sVar31;
  short sVar32;
  short sVar33;
  short sVar34;
  short sVar35;
  short sVar36;
  int iVar37;
  int iVar38;
  int iVar39;
  int iVar40;
  int iVar41;
  int iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  
  sVar1 = pSrc[1];
  sVar2 = pSrc[3];
  sVar3 = pSrc[5];
  sVar4 = pSrc[7];
  sVar5 = pSrc[9];
  sVar6 = pSrc[0xb];
  sVar7 = pSrc[0xd];
  sVar8 = pSrc[0xf];
  sVar9 = pSrc[0x19];
  sVar10 = pSrc[0x1b];
  sVar11 = pSrc[0x1d];
  sVar12 = pSrc[0x1f];
  sVar13 = pSrc[0x21];
  sVar14 = pSrc[0x23];
  sVar15 = pSrc[0x25];
  sVar16 = pSrc[0x27];
  sVar17 = pSrc[0x29];
  sVar18 = pSrc[0x2b];
  sVar19 = pSrc[0x2d];
  sVar20 = pSrc[0x2f];
  sVar21 = pSrc[0x11];
  sVar22 = pSrc[0x13];
  sVar23 = pSrc[0x15];
  sVar24 = pSrc[0x17];
  sVar25 = pSrc[0x31];
  sVar26 = pSrc[0x33];
  sVar27 = pSrc[0x35];
  sVar28 = pSrc[0x37];
  sVar29 = pSrc[2];
  iVar37 = (int)pSrc[10];
  sVar30 = pSrc[0x12];
  iVar42 = (int)pSrc[0x1a];
  sVar31 = pSrc[0x22];
  iVar38 = (int)pSrc[0x2a];
  sVar32 = pSrc[0x32];
  sVar33 = pSrc[6];
  iVar39 = (int)pSrc[0xe];
  sVar34 = pSrc[0x16];
  iVar40 = (int)pSrc[0x1e];
  sVar35 = pSrc[0x26];
  iVar41 = (int)pSrc[0x2e];
  sVar36 = pSrc[0x36];
  R->v[0][0] = sVar4 * -0xb8 + sVar3 * 0xda + sVar2 * -0x145 + sVar1 * 0x3a0 + 0x200 >> 10;
  iVar43 = sVar8 * -0xb8 + sVar7 * 0xda + sVar6 * -0x145 + sVar5 * 0x3a0 + 0x200 >> 10;
  iVar46 = sVar12 * -0xb8 + sVar11 * 0xda + sVar10 * -0x145 + sVar9 * 0x3a0 + 0x200 >> 10;
  iVar44 = sVar20 * -0xb8 + sVar19 * 0xda + sVar18 * -0x145 + sVar17 * 0x3a0 + 0x200 >> 10;
  R->v[0][1] = iVar44 * -0x168 + 0x200 + iVar46 * 0x32a + iVar43 * 0x1aa >> 10;
  R->v[0][2] = sVar16 * -0xb8 + sVar15 * 0xda + sVar14 * -0x145 + sVar13 * 0x3a0 + 0x200 >> 10;
  R->v[0][3] = iVar44 * 0x1f6 + 0x200 + iVar46 * -99 + iVar43 * 0x17 >> 10;
  R->v[1][0] = (int)sVar29;
  R->v[1][1] = iVar38 * -0x168 + 0x200 + iVar42 * 0x32a + iVar37 * 0x1aa >> 10;
  R->v[1][2] = (int)sVar31;
  R->v[1][3] = iVar38 * 0x1f6 + 0x200 + iVar42 * -99 + iVar37 * 0x17 >> 10;
  R->v[2][0] = sVar4 * -0x17f + sVar3 * 0x313 + sVar2 * 0x20e + sVar1 * -0x4b + 0x200 >> 10;
  iVar45 = sVar8 * -0x17f + sVar7 * 0x313 + sVar6 * 0x20e + sVar5 * -0x4b + 0x200 >> 10;
  iVar48 = sVar12 * -0x17f + sVar11 * 0x313 + sVar10 * 0x20e + sVar9 * -0x4b + 0x200 >> 10;
  iVar47 = sVar20 * -0x17f + sVar19 * 0x313 + sVar18 * 0x20e + sVar17 * -0x4b + 0x200 >> 10;
  R->v[2][1] = iVar47 * -0x168 + 0x200 + iVar48 * 0x32a + iVar45 * 0x1aa >> 10;
  R->v[2][2] = sVar16 * -0x17f + sVar15 * 0x313 + sVar14 * 0x20e + sVar13 * -0x4b + 0x200 >> 10;
  R->v[2][3] = iVar47 * 0x1f6 + 0x200 + iVar48 * -99 + iVar45 * 0x17 >> 10;
  R->v[3][0] = (int)sVar33;
  R->v[3][1] = iVar41 * -0x168 + 0x200 + iVar40 * 0x32a + iVar39 * 0x1aa >> 10;
  R->v[3][2] = (int)sVar35;
  R->v[3][3] = iVar41 * 0x1f6 + 0x200 + iVar40 * -99 + iVar39 * 0x17 >> 10;
  S->v[0][0] = iVar44 * 0xda + 0x200 + iVar46 * -0x145 + iVar43 * 0x3a0 >> 10;
  S->v[0][1] = sVar24 * -0xb8 + sVar23 * 0xda + sVar22 * -0x145 + sVar21 * 0x3a0 + 0x200 >> 10;
  S->v[0][2] = iVar44 * 0x313 + 0x200 + iVar46 * 0x20e + iVar43 * -0x4b >> 10;
  S->v[0][3] = sVar28 * -0xb8 + sVar27 * 0xda + sVar26 * -0x145 + sVar25 * 0x3a0 + 0x200 >> 10;
  S->v[1][0] = iVar38 * 0xda + 0x200 + iVar42 * -0x145 + iVar37 * 0x3a0 >> 10;
  S->v[1][1] = (int)sVar30;
  S->v[1][2] = iVar38 * 0x313 + 0x200 + iVar42 * 0x20e + iVar37 * -0x4b >> 10;
  S->v[1][3] = (int)sVar32;
  S->v[2][0] = iVar47 * 0xda + 0x200 + iVar48 * -0x145 + iVar45 * 0x3a0 >> 10;
  S->v[2][1] = sVar24 * -0x17f + sVar23 * 0x313 + sVar22 * 0x20e + sVar21 * -0x4b + 0x200 >> 10;
  S->v[2][2] = iVar47 * 0x313 + 0x200 + iVar48 * 0x20e + iVar45 * -0x4b >> 10;
  S->v[2][3] = sVar28 * -0x17f + sVar27 * 0x313 + sVar26 * 0x20e + sVar25 * -0x4b + 0x200 >> 10;
  S->v[3][0] = iVar41 * 0xda + 0x200 + iVar40 * -0x145 + iVar39 * 0x3a0 >> 10;
  S->v[3][1] = (int)sVar34;
  S->v[3][2] = iVar41 * 0x313 + 0x200 + iVar40 * 0x20e + iVar39 * -0x4b >> 10;
  S->v[3][3] = (int)sVar36;
  return;
}

Assistant:

static void calc(Matrix44& R, Matrix44& S, const jpgd_block_t* pSrc)
    {
      // 4x8 = 4x8 times 8x8, matrix 0 is constant
      const Temp_Type X100 = D(F(0.906127f) * AT(1, 0) + F(-0.318190f) * AT(3, 0) + F(0.212608f) * AT(5, 0) + F(-0.180240f) * AT(7, 0));
      const Temp_Type X101 = D(F(0.906127f) * AT(1, 1) + F(-0.318190f) * AT(3, 1) + F(0.212608f) * AT(5, 1) + F(-0.180240f) * AT(7, 1));
      const Temp_Type X102 = D(F(0.906127f) * AT(1, 2) + F(-0.318190f) * AT(3, 2) + F(0.212608f) * AT(5, 2) + F(-0.180240f) * AT(7, 2));
      const Temp_Type X103 = D(F(0.906127f) * AT(1, 3) + F(-0.318190f) * AT(3, 3) + F(0.212608f) * AT(5, 3) + F(-0.180240f) * AT(7, 3));
      const Temp_Type X104 = D(F(0.906127f) * AT(1, 4) + F(-0.318190f) * AT(3, 4) + F(0.212608f) * AT(5, 4) + F(-0.180240f) * AT(7, 4));
      const Temp_Type X105 = D(F(0.906127f) * AT(1, 5) + F(-0.318190f) * AT(3, 5) + F(0.212608f) * AT(5, 5) + F(-0.180240f) * AT(7, 5));
      const Temp_Type X106 = D(F(0.906127f) * AT(1, 6) + F(-0.318190f) * AT(3, 6) + F(0.212608f) * AT(5, 6) + F(-0.180240f) * AT(7, 6));
      const Temp_Type X107 = D(F(0.906127f) * AT(1, 7) + F(-0.318190f) * AT(3, 7) + F(0.212608f) * AT(5, 7) + F(-0.180240f) * AT(7, 7));
      const Temp_Type X110 = AT(2, 0);
      const Temp_Type X111 = AT(2, 1);
      const Temp_Type X112 = AT(2, 2);
      const Temp_Type X113 = AT(2, 3);
      const Temp_Type X114 = AT(2, 4);
      const Temp_Type X115 = AT(2, 5);
      const Temp_Type X116 = AT(2, 6);
      const Temp_Type X117 = AT(2, 7);
      const Temp_Type X120 = D(F(-0.074658f) * AT(1, 0) + F(0.513280f) * AT(3, 0) + F(0.768178f) * AT(5, 0) + F(-0.375330f) * AT(7, 0));
      const Temp_Type X121 = D(F(-0.074658f) * AT(1, 1) + F(0.513280f) * AT(3, 1) + F(0.768178f) * AT(5, 1) + F(-0.375330f) * AT(7, 1));
      const Temp_Type X122 = D(F(-0.074658f) * AT(1, 2) + F(0.513280f) * AT(3, 2) + F(0.768178f) * AT(5, 2) + F(-0.375330f) * AT(7, 2));
      const Temp_Type X123 = D(F(-0.074658f) * AT(1, 3) + F(0.513280f) * AT(3, 3) + F(0.768178f) * AT(5, 3) + F(-0.375330f) * AT(7, 3));
      const Temp_Type X124 = D(F(-0.074658f) * AT(1, 4) + F(0.513280f) * AT(3, 4) + F(0.768178f) * AT(5, 4) + F(-0.375330f) * AT(7, 4));
      const Temp_Type X125 = D(F(-0.074658f) * AT(1, 5) + F(0.513280f) * AT(3, 5) + F(0.768178f) * AT(5, 5) + F(-0.375330f) * AT(7, 5));
      const Temp_Type X126 = D(F(-0.074658f) * AT(1, 6) + F(0.513280f) * AT(3, 6) + F(0.768178f) * AT(5, 6) + F(-0.375330f) * AT(7, 6));
      const Temp_Type X127 = D(F(-0.074658f) * AT(1, 7) + F(0.513280f) * AT(3, 7) + F(0.768178f) * AT(5, 7) + F(-0.375330f) * AT(7, 7));
      const Temp_Type X130 = AT(6, 0);
      const Temp_Type X131 = AT(6, 1);
      const Temp_Type X132 = AT(6, 2);
      const Temp_Type X133 = AT(6, 3);
      const Temp_Type X134 = AT(6, 4);
      const Temp_Type X135 = AT(6, 5);
      const Temp_Type X136 = AT(6, 6);
      const Temp_Type X137 = AT(6, 7);
      // 80 muls 48 adds

      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      R.at(0, 0) = X100;
      R.at(0, 1) = D(X101 * F(0.415735f) + X103 * F(0.791065f) + X105 * F(-0.352443f) + X107 * F(0.277785f));
      R.at(0, 2) = X104;
      R.at(0, 3) = D(X101 * F(0.022887f) + X103 * F(-0.097545f) + X105 * F(0.490393f) + X107 * F(0.865723f));
      R.at(1, 0) = X110;
      R.at(1, 1) = D(X111 * F(0.415735f) + X113 * F(0.791065f) + X115 * F(-0.352443f) + X117 * F(0.277785f));
      R.at(1, 2) = X114;
      R.at(1, 3) = D(X111 * F(0.022887f) + X113 * F(-0.097545f) + X115 * F(0.490393f) + X117 * F(0.865723f));
      R.at(2, 0) = X120;
      R.at(2, 1) = D(X121 * F(0.415735f) + X123 * F(0.791065f) + X125 * F(-0.352443f) + X127 * F(0.277785f));
      R.at(2, 2) = X124;
      R.at(2, 3) = D(X121 * F(0.022887f) + X123 * F(-0.097545f) + X125 * F(0.490393f) + X127 * F(0.865723f));
      R.at(3, 0) = X130;
      R.at(3, 1) = D(X131 * F(0.415735f) + X133 * F(0.791065f) + X135 * F(-0.352443f) + X137 * F(0.277785f));
      R.at(3, 2) = X134;
      R.at(3, 3) = D(X131 * F(0.022887f) + X133 * F(-0.097545f) + X135 * F(0.490393f) + X137 * F(0.865723f));
      // 40 muls 24 adds
      // 4x4 = 4x8 times 8x4, matrix 1 is constant
      S.at(0, 0) = D(X101 * F(0.906127f) + X103 * F(-0.318190f) + X105 * F(0.212608f) + X107 * F(-0.180240f));
      S.at(0, 1) = X102;
      S.at(0, 2) = D(X101 * F(-0.074658f) + X103 * F(0.513280f) + X105 * F(0.768178f) + X107 * F(-0.375330f));
      S.at(0, 3) = X106;
      S.at(1, 0) = D(X111 * F(0.906127f) + X113 * F(-0.318190f) + X115 * F(0.212608f) + X117 * F(-0.180240f));
      S.at(1, 1) = X112;
      S.at(1, 2) = D(X111 * F(-0.074658f) + X113 * F(0.513280f) + X115 * F(0.768178f) + X117 * F(-0.375330f));
      S.at(1, 3) = X116;
      S.at(2, 0) = D(X121 * F(0.906127f) + X123 * F(-0.318190f) + X125 * F(0.212608f) + X127 * F(-0.180240f));
      S.at(2, 1) = X122;
      S.at(2, 2) = D(X121 * F(-0.074658f) + X123 * F(0.513280f) + X125 * F(0.768178f) + X127 * F(-0.375330f));
      S.at(2, 3) = X126;
      S.at(3, 0) = D(X131 * F(0.906127f) + X133 * F(-0.318190f) + X135 * F(0.212608f) + X137 * F(-0.180240f));
      S.at(3, 1) = X132;
      S.at(3, 2) = D(X131 * F(-0.074658f) + X133 * F(0.513280f) + X135 * F(0.768178f) + X137 * F(-0.375330f));
      S.at(3, 3) = X136;
      // 40 muls 24 adds
    }